

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::RobustnessTestCase::Params::Params
          (Params *this,string *name,string *description,RobustAccessType *robustAccessType,
          ContextResetType *contextResetType,ShaderType *shaderType,ResourceType *resourceType,
          ReadWriteType *readWriteType)

{
  std::__cxx11::string::string((string *)this,(string *)name);
  std::__cxx11::string::string((string *)&this->m_description,(string *)description);
  this->m_robustAccessType = *robustAccessType;
  this->m_contextResetType = *contextResetType;
  this->m_shaderType = *shaderType;
  this->m_resourceType = *resourceType;
  this->m_readWriteType = *readWriteType;
  return;
}

Assistant:

RobustnessTestCase::Params::Params (const string&				name,
									const string&				description,
									const RobustAccessType&		robustAccessType,
									const ContextResetType&		contextResetType,
									const ShaderType&			shaderType,
									const ResourceType&			resourceType,
									const ReadWriteType&		readWriteType)
	: m_name				(name)
	, m_description			(description)
	, m_robustAccessType	(robustAccessType)
	, m_contextResetType	(contextResetType)
	, m_shaderType			(shaderType)
	, m_resourceType		(resourceType)
	, m_readWriteType		(readWriteType)
{
}